

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digital_port_bits.cpp
# Opt level: O0

void __thiscall
ximu::DigitalPortBits::DigitalPortBits
          (DigitalPortBits *this,bool ax0,bool ax1,bool ax2,bool ax3,bool ax4,bool ax5,bool ax6,
          bool ax7)

{
  bool ax7_local;
  bool ax6_local;
  bool ax5_local;
  bool ax4_local;
  bool ax3_local;
  bool ax2_local;
  bool ax1_local;
  bool ax0_local;
  DigitalPortBits *this_local;
  
  set(this,ax0,0);
  set(this,ax1,1);
  set(this,ax2,2);
  set(this,ax3,3);
  set(this,ax4,4);
  set(this,ax5,5);
  set(this,ax6,6);
  set(this,ax7,7);
  return;
}

Assistant:

DigitalPortBits::DigitalPortBits(
    bool ax0, bool ax1, bool ax2, bool ax3,
    bool ax4, bool ax5, bool ax6, bool ax7) {
  set(ax0, 0);
  set(ax1, 1);
  set(ax2, 2);
  set(ax3, 3);
  set(ax4, 4);
  set(ax5, 5);
  set(ax6, 6);
  set(ax7, 7);
}